

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O1

void min_w_cb(Fl_Value_Input *i,void *v)

{
  double dVar1;
  _func_int **pp_Var2;
  bool bVar3;
  int iVar4;
  Fl_Type *pFVar5;
  
  if ((char *)v == "LOAD") {
    iVar4 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x21])();
    pp_Var2 = (((i->super_Fl_Valuator).super_Fl_Widget.parent_)->super_Fl_Widget)._vptr_Fl_Widget;
    if (iVar4 != 0) {
      (*pp_Var2[5])();
      Fl_Valuator::value(&i->super_Fl_Valuator,(double)current_widget[1].super_Fl_Type.level);
      return;
    }
    (*pp_Var2[6])();
    return;
  }
  if (Fl_Type::first != (Fl_Type *)0x0) {
    dVar1 = (i->super_Fl_Valuator).value_;
    bVar3 = false;
    pFVar5 = Fl_Type::first;
    do {
      if (pFVar5->selected != '\0') {
        iVar4 = (*pFVar5->_vptr_Fl_Type[0x21])(pFVar5);
        if (iVar4 != 0) {
          current_widget[1].super_Fl_Type.level = (int)dVar1;
          bVar3 = true;
        }
      }
      pFVar5 = pFVar5->next;
    } while (pFVar5 != (Fl_Type *)0x0);
    if (bVar3) {
      set_modflag(1);
      return;
    }
  }
  return;
}

Assistant:

void min_w_cb(Fl_Value_Input* i, void* v) {
  if (v == LOAD) {
    if (!current_widget->is_window()) {i->parent()->hide(); return;}
    i->parent()->show();
    i->value(((Fl_Window_Type*)current_widget)->sr_min_w);
  } else {
    int mod = 0;
    int n = (int)i->value();
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_window()) {
        ((Fl_Window_Type*)current_widget)->sr_min_w = n;
        mod = 1;
      }
    }
    if (mod) set_modflag(1);
  }
}